

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O1

uchar * print(cJSON *item,cJSON_bool format,internal_hooks *hooks)

{
  size_t sVar1;
  cJSON_bool cVar2;
  size_t sVar3;
  uchar *puVar4;
  ulong __n;
  long in_FS_OFFSET;
  printbuffer buffer [1];
  printbuffer local_68;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_68.hooks.deallocate = (_func_void_void_ptr *)0x0;
  local_68.hooks.reallocate = (_func_void_ptr_void_ptr_size_t *)0x0;
  local_68.noalloc = 0;
  local_68.format = 0;
  local_68.hooks.allocate = (_func_void_ptr_size_t *)0x0;
  local_68.offset = 0;
  local_68.depth = 0;
  local_68.buffer = (uchar *)0x0;
  local_68.length = 0;
  local_68.buffer = (uchar *)(*global_hooks.allocate)(0x100);
  local_68.format = format;
  local_68.hooks.allocate = global_hooks.allocate;
  local_68.hooks.deallocate = global_hooks.deallocate;
  local_68.hooks.reallocate = global_hooks.reallocate;
  if ((local_68.buffer != (uchar *)0x0) &&
     (cVar2 = print_value(item,&local_68), sVar1 = local_68.offset, puVar4 = local_68.buffer,
     cVar2 != 0)) {
    if (local_68.buffer != (uchar *)0x0) {
      sVar3 = strlen((char *)(local_68.buffer + local_68.offset));
      local_68.offset = sVar3 + sVar1;
    }
    if (global_hooks.reallocate == (_func_void_ptr_void_ptr_size_t *)0x0) {
      puVar4 = (uchar *)(*global_hooks.allocate)(local_68.offset + 1);
      if (puVar4 != (uchar *)0x0) {
        __n = local_68.offset + 1;
        if (local_68.length < local_68.offset + 1) {
          __n = local_68.length;
        }
        memcpy(puVar4,local_68.buffer,__n);
        puVar4[local_68.offset] = '\0';
        (*global_hooks.deallocate)(local_68.buffer);
        goto LAB_0010299d;
      }
    }
    else {
      puVar4 = (uchar *)(*global_hooks.reallocate)(puVar4,local_68.length);
      local_68.buffer = (uchar *)0x0;
      if (puVar4 != (uchar *)0x0) goto LAB_0010299d;
    }
  }
  if (local_68.buffer != (uchar *)0x0) {
    (*global_hooks.deallocate)(local_68.buffer);
  }
  puVar4 = (uchar *)0x0;
LAB_0010299d:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return puVar4;
}

Assistant:

static unsigned char *print(const cJSON * const item, cJSON_bool format, const internal_hooks * const hooks)
{
    printbuffer buffer[1];
    unsigned char *printed = NULL;

    memset(buffer, 0, sizeof(buffer));

    /* create buffer */
    buffer->buffer = (unsigned char*) hooks->allocate(256);
    buffer->format = format;
    buffer->hooks = *hooks;
    if (buffer->buffer == NULL)
    {
        goto fail;
    }

    /* print the value */
    if (!print_value(item, buffer))
    {
        goto fail;
    }
    update_offset(buffer);

    /* check if reallocate is available */
    if (hooks->reallocate != NULL)
    {
        printed = (unsigned char*) hooks->reallocate(buffer->buffer, buffer->length);
        buffer->buffer = NULL;
        if (printed == NULL) {
            goto fail;
        }
    }
    else /* otherwise copy the JSON over to a new buffer */
    {
        printed = (unsigned char*) hooks->allocate(buffer->offset + 1);
        if (printed == NULL)
        {
            goto fail;
        }
        memcpy(printed, buffer->buffer, cjson_min(buffer->length, buffer->offset + 1));
        printed[buffer->offset] = '\0'; /* just to be sure */

        /* free the buffer */
        hooks->deallocate(buffer->buffer);
    }

    return printed;

fail:
    if (buffer->buffer != NULL)
    {
        hooks->deallocate(buffer->buffer);
    }

    if (printed != NULL)
    {
        hooks->deallocate(printed);
    }

    return NULL;
}